

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O2

int Gem_GroupUnpack(int Groups,int *pVars)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  iVar1 = 0;
  for (; Groups != 0; Groups = Groups >> 1) {
    if ((Groups & 1U) != 0) {
      lVar3 = (long)iVar1;
      iVar1 = iVar1 + 1;
      pVars[lVar3] = iVar2;
    }
    iVar2 = iVar2 + 1;
  }
  return iVar1;
}

Assistant:

int Gem_GroupUnpack( int Groups, int * pVars )
{
    int v, nGroups = 0;
    for ( v = 0; Groups; v++, Groups >>= 1 )
        if ( Groups & 1 )
            pVars[nGroups++] = v;
    return nGroups;
}